

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowStorageDevice,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcDistributionFlowElement *this;
  
  this = (IfcDistributionFlowElement *)operator_new(0x180);
  *(undefined ***)&this->field_0x168 = &PTR__Object_00816a50;
  *(undefined8 *)
   &this[1].super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject = 0;
  *(char **)&this[1].super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
             field_0x8 = "IfcFlowStorageDevice";
  Assimp::IFC::Schema_2x3::IfcDistributionFlowElement::IfcDistributionFlowElement
            (this,&PTR_construction_vtable_24__0082e948);
  *(undefined ***)
   &(this->super_IfcDistributionElement).super_IfcElement.super_IfcProduct.super_IfcObject =
       &PTR__IfcFlowStorageDevice_0082e7f0;
  *(undefined ***)&this->field_0x168 = &PTR__IfcFlowStorageDevice_0082e930;
  *(undefined ***)
   &(this->super_IfcDistributionElement).super_IfcElement.super_IfcProduct.super_IfcObject.
    field_0x88 = &PTR__IfcFlowStorageDevice_0082e818;
  (this->super_IfcDistributionElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFlowStorageDevice_0082e840;
  *(undefined ***)
   &(this->super_IfcDistributionElement).super_IfcElement.super_IfcProduct.super_IfcObject.
    field_0xd0 = &PTR__IfcFlowStorageDevice_0082e868;
  *(undefined ***)
   &(this->super_IfcDistributionElement).super_IfcElement.super_IfcProduct.field_0x100 =
       &PTR__IfcFlowStorageDevice_0082e890;
  *(undefined ***)&(this->super_IfcDistributionElement).super_IfcElement.field_0x138 =
       &PTR__IfcFlowStorageDevice_0082e8b8;
  *(undefined ***)&(this->super_IfcDistributionElement).super_IfcElement.field_0x148 =
       &PTR__IfcFlowStorageDevice_0082e8e0;
  *(undefined ***)&(this->super_IfcDistributionElement).field_0x158 =
       &PTR__IfcFlowStorageDevice_0082e908;
  GenericFill<Assimp::IFC::Schema_2x3::IfcElement>(db,params,(IfcElement *)this);
  return (Object *)
         (&(this->super_IfcDistributionElement).super_IfcElement.super_IfcProduct.super_IfcObject.
           field_0x0 +
         *(long *)(*(long *)&(this->super_IfcDistributionElement).super_IfcElement.super_IfcProduct.
                             super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }